

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getNumberOfLinesRange
          (LineRenderCase *this,int queryAreaBegin,int queryAreaEnd,float patternStart,
          float patternSize,int viewportArea,QueryDirection queryDir)

{
  uint uVar1;
  undefined4 in_register_00000034;
  uint uVar2;
  int in_R9D;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar2 = (uint)*(byte *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0x80 +
                         (ulong)(in_R9D == 0));
  iVar3 = *(int *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0xd4);
  iVar4 = 0;
  iVar5 = 0;
  if ((int)uVar2 < (int)(iVar3 + uVar2)) {
    if (*(char *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0xd8) == '\0') {
      fVar6 = 1.0;
    }
    else {
      fVar6 = (float)*(int *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0xdc);
    }
    fVar7 = (float)iVar3;
    iVar5 = 0;
    iVar4 = 0;
    do {
      fVar8 = ((((float)(int)uVar2 / fVar7) * patternSize + patternStart) * 0.5 + 0.5) *
              (float)(int)queryDir;
      if ((fVar8 <= (float)queryAreaEnd + 1.0) || ((float)viewportArea + -1.0 <= fVar8)) {
        uVar1 = -(uint)(fVar8 < fVar6 * 0.5 + (float)viewportArea + 1.0 &&
                       ((float)queryAreaEnd - fVar6 * 0.5) + -1.0 < fVar8) & 1;
      }
      else {
        iVar5 = iVar5 + 1;
        uVar1 = 1;
      }
      iVar4 = iVar4 + uVar1;
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  *(int *)&(this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = iVar5;
  *(int *)((long)&(this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode + 4) = iVar4;
  return (IVec2)(int  [2])this;
}

Assistant:

tcu::IVec2 LineRenderCase::getNumberOfLinesRange (int queryAreaBegin, int queryAreaEnd, float patternStart, float patternSize, int viewportArea, QueryDirection queryDir) const
{
	// pattern is not symmetric due to mirroring
	const int	patternStartNdx	= (queryDir == DIRECTION_HORIZONTAL) ? ((m_hasGeometryStage) ? (1) : (0)) : ((m_hasTessellationStage) ? (1) : (0));
	const int	patternEndNdx	= patternStartNdx + m_patternSide;

	int			numLinesMin		= 0;
	int			numLinesMax		= 0;

	for (int lineNdx = patternStartNdx; lineNdx < patternEndNdx; ++lineNdx)
	{
		const float linePos		= (patternStart + (float(lineNdx) / float(m_patternSide)) * patternSize) * 0.5f + 0.5f;
		const float lineWidth	= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);

		if (linePos * (float)viewportArea > (float)queryAreaBegin + 1.0f &&
			linePos * (float)viewportArea < (float)queryAreaEnd   - 1.0f)
		{
			// line center is within the area
			++numLinesMin;
			++numLinesMax;
		}
		else if (linePos * (float)viewportArea > (float)queryAreaBegin - lineWidth*0.5f - 1.0f &&
		         linePos * (float)viewportArea < (float)queryAreaEnd   + lineWidth*0.5f + 1.0f)
		{
			// line could leak into area
			++numLinesMax;
		}
	}

	return tcu::IVec2(numLinesMin, numLinesMax);
}